

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O1

void __thiscall
TEST_TestMemoryAccountant_reportWithCacheSizesEmpty_Test::
~TEST_TestMemoryAccountant_reportWithCacheSizesEmpty_Test
          (TEST_TestMemoryAccountant_reportWithCacheSizesEmpty_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupTestMemoryAccountant_003884c0;
  ExecFunctionWithoutParameters::~ExecFunctionWithoutParameters
            ((ExecFunctionWithoutParameters *)
             &(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).testFunction);
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture);
  MemoryAccountant::~MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportWithCacheSizesEmpty)
{
    size_t cacheSizes[] = {0};

    accountant.useCacheSizes(cacheSizes, 0);
    accountant.alloc(4);

    STRCMP_EQUAL("CppUTest Memory Accountant report (with cache sizes):\n"
                 "Cache size          # allocations    # deallocations   max # allocations at one time\n"
                 "other                   1                0                 1\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}